

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclLaunchData.cpp
# Opt level: O3

void __thiscall
xmrig::OclLaunchData::OclLaunchData
          (OclLaunchData *this,Miner *miner,OclConfig *config,OclPlatform *platform,
          OclThread *thread,OclDevice *device,int64_t affinity)

{
  cl_platform_id p_Var1;
  size_t sVar2;
  size_t sVar3;
  _WordT _Var4;
  uint32_t uVar5;
  OclVendor OVar6;
  PciTopology PVar7;
  bool bVar8;
  undefined6 uVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  uint32_t uVar13;
  uint32_t uVar14;
  uint32_t uVar15;
  
  this->ctx = (cl_context)0x0;
  this->cache = config->m_cache;
  this->affinity = affinity;
  this->miner = miner;
  p_Var1 = device->m_platform;
  (this->device).m_id = device->m_id;
  (this->device).m_platform = p_Var1;
  String::String(&(this->device).m_board,&device->m_board);
  String::String(&(this->device).m_name,&device->m_name);
  String::String(&(this->device).m_vendor,&device->m_vendor);
  (this->device).m_type = device->m_type;
  sVar2 = device->m_maxMemoryAlloc;
  sVar3 = device->m_globalMemory;
  uVar5 = device->m_index;
  OVar6 = device->m_vendorId;
  PVar7 = device->m_topology;
  (this->device).m_computeUnits = device->m_computeUnits;
  (this->device).m_index = uVar5;
  (this->device).m_vendorId = OVar6;
  (this->device).m_topology = PVar7;
  (this->device).m_maxMemoryAlloc = sVar2;
  (this->device).m_globalMemory = sVar3;
  sVar2 = platform->m_index;
  (this->platform).m_id = platform->m_id;
  (this->platform).m_index = sVar2;
  bVar8 = thread->m_gcnAsm;
  uVar9 = *(undefined6 *)&thread->field_0x2;
  _Var4 = (thread->m_fields).super__Base_bitset<1UL>._M_w;
  (this->thread).m_datasetHost = thread->m_datasetHost;
  (this->thread).m_gcnAsm = bVar8;
  *(undefined6 *)&(this->thread).field_0x2 = uVar9;
  (this->thread).m_fields.super__Base_bitset<1UL>._M_w = _Var4;
  std::vector<long,_std::allocator<long>_>::vector(&(this->thread).m_threads,&thread->m_threads);
  uVar12 = thread->m_bfactor;
  uVar13 = thread->m_index;
  uVar14 = thread->m_intensity;
  uVar15 = thread->m_memChunk;
  uVar5 = thread->m_stridedIndex;
  uVar10 = thread->m_unrollFactor;
  uVar11 = thread->m_worksize;
  (this->thread).m_memChunk = thread->m_memChunk;
  (this->thread).m_stridedIndex = uVar5;
  (this->thread).m_unrollFactor = uVar10;
  (this->thread).m_worksize = uVar11;
  (this->thread).m_bfactor = uVar12;
  (this->thread).m_index = uVar13;
  (this->thread).m_intensity = uVar14;
  (this->thread).m_memChunk = uVar15;
  return;
}

Assistant:

xmrig::OclLaunchData::OclLaunchData(const Miner *miner, const OclConfig &config, const OclPlatform &platform, const OclThread &thread, const OclDevice &device, int64_t affinity) :
    cache(config.isCacheEnabled()),
    affinity(affinity),
    miner(miner),
    device(device),
    platform(platform),
    thread(thread)
{
}